

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O0

bool __thiscall crnlib::vec<2U,_float>::operator<(vec<2U,_float> *this,vec<2U,_float> *rhs)

{
  uint i;
  vec<2U,_float> *rhs_local;
  vec<2U,_float> *this_local;
  
  i = 0;
  while( true ) {
    if (1 < i) {
      return false;
    }
    if (this->m_s[i] < rhs->m_s[i]) break;
    if ((this->m_s[i] != rhs->m_s[i]) || (NAN(this->m_s[i]) || NAN(rhs->m_s[i]))) {
      return false;
    }
    i = i + 1;
  }
  return true;
}

Assistant:

inline bool operator<(const vec& rhs) const {
    for (uint i = 0; i < N; i++) {
      if (m_s[i] < rhs.m_s[i])
        return true;
      else if (!(m_s[i] == rhs.m_s[i]))
        return false;
    }

    return false;
  }